

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXExporter::FBXExporter(FBXExporter *this,aiScene *pScene,ExportProperties *pProperties)

{
  _Rb_tree_header *p_Var1;
  
  this->binary = false;
  this->mScene = pScene;
  this->mProperties = pProperties;
  p_Var1 = &(this->node_uids)._M_t._M_impl.super__Rb_tree_header;
  (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->connections).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->connections).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->connections).super__Vector_base<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mesh_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->material_uids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->node_uids)._M_t._M_impl = 0;
  *(undefined8 *)&(this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_uid = 999999;
  return;
}

Assistant:

FBXExporter::FBXExporter ( const aiScene* pScene, const ExportProperties* pProperties )
: binary(false)
, mScene(pScene)
, mProperties(pProperties)
, outfile()
, connections()
, mesh_uids()
, material_uids()
, node_uids() {
    // will probably need to determine UIDs, connections, etc here.
    // basically anything that needs to be known
    // before we start writing sections to the stream.
}